

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::wrap_hard(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int times)

{
  ostream *poVar1;
  bool bVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (times < 1) {
    return;
  }
  if ((this->paragraphSpacing_ < 1) || (this->curParagraphLines_ < this->paragraphSpacingThreshold_)
     ) {
    if (times == 1) {
      std::operator<<((ostream *)this->os_,'\n');
      goto LAB_0011e5bb;
    }
  }
  else {
    times = this->paragraphSpacing_ + 1;
  }
  poVar1 = (ostream *)this->os_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)times);
  std::operator<<(poVar1,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  this->curBlankLines_ = times + -1 + this->curBlankLines_;
LAB_0011e5bb:
  bVar2 = at_begin_of_line(this);
  if (bVar2) {
    this->curBlankLines_ = this->curBlankLines_ + 1;
  }
  this->curCol_ = 0;
  this->curParagraphLines_ = 1;
  return;
}

Assistant:

void wrap_hard(int times = 1) {
        if(times < 1) return;

        if(paragraph_spacing() > 0 &&
           paragraph_lines() >= min_paragraph_lines_for_spacing())
        {
            times = paragraph_spacing() + 1;
        }

        if(times > 1) {
            os_ << string_type(size_type(times), '\n');
            curBlankLines_ += times - 1;
        } else {
            os_ << '\n';
        }
        if(at_begin_of_line()) {
            ++curBlankLines_;
        }
        curCol_ = 0;
        curParagraphLines_ = 1;
    }